

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.cc
# Opt level: O3

ZeroCopyOutputStream * __thiscall
google::protobuf::compiler::GeneratorResponseContext::OpenForInsert
          (GeneratorResponseContext *this,string *filename,string *insertion_point)

{
  int iVar1;
  CodeGeneratorResponse *pCVar2;
  void **ppvVar3;
  CodeGeneratorResponse_File *pCVar4;
  string *psVar5;
  StringOutputStream *this_00;
  int iVar6;
  
  pCVar2 = this->response_;
  iVar1 = (pCVar2->file_).super_RepeatedPtrFieldBase.current_size_;
  iVar6 = (pCVar2->file_).super_RepeatedPtrFieldBase.allocated_size_;
  if (iVar1 < iVar6) {
    ppvVar3 = (pCVar2->file_).super_RepeatedPtrFieldBase.elements_;
    (pCVar2->file_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pCVar4 = (CodeGeneratorResponse_File *)ppvVar3[iVar1];
  }
  else {
    if (iVar6 == (pCVar2->file_).super_RepeatedPtrFieldBase.total_size_) {
      internal::RepeatedPtrFieldBase::Reserve(&(pCVar2->file_).super_RepeatedPtrFieldBase,iVar6 + 1)
      ;
      iVar6 = (pCVar2->file_).super_RepeatedPtrFieldBase.allocated_size_;
    }
    (pCVar2->file_).super_RepeatedPtrFieldBase.allocated_size_ = iVar6 + 1;
    pCVar4 = internal::GenericTypeHandler<google::protobuf::compiler::CodeGeneratorResponse_File>::
             New();
    ppvVar3 = (pCVar2->file_).super_RepeatedPtrFieldBase.elements_;
    iVar1 = (pCVar2->file_).super_RepeatedPtrFieldBase.current_size_;
    (pCVar2->file_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    ppvVar3[iVar1] = pCVar4;
  }
  *(byte *)pCVar4->_has_bits_ = (byte)pCVar4->_has_bits_[0] | 1;
  psVar5 = pCVar4->name_;
  if (psVar5 == (string *)internal::kEmptyString_abi_cxx11_) {
    psVar5 = (string *)operator_new(0x20);
    (psVar5->_M_dataplus)._M_p = (pointer)&psVar5->field_2;
    psVar5->_M_string_length = 0;
    (psVar5->field_2)._M_local_buf[0] = '\0';
    pCVar4->name_ = psVar5;
  }
  std::__cxx11::string::_M_assign((string *)psVar5);
  *(byte *)pCVar4->_has_bits_ = (byte)pCVar4->_has_bits_[0] | 2;
  psVar5 = pCVar4->insertion_point_;
  if (psVar5 == (string *)internal::kEmptyString_abi_cxx11_) {
    psVar5 = (string *)operator_new(0x20);
    (psVar5->_M_dataplus)._M_p = (pointer)&psVar5->field_2;
    psVar5->_M_string_length = 0;
    (psVar5->field_2)._M_local_buf[0] = '\0';
    pCVar4->insertion_point_ = psVar5;
  }
  std::__cxx11::string::_M_assign((string *)psVar5);
  this_00 = (StringOutputStream *)operator_new(0x10);
  *(byte *)pCVar4->_has_bits_ = (byte)pCVar4->_has_bits_[0] | 4;
  psVar5 = pCVar4->content_;
  if (psVar5 == (string *)internal::kEmptyString_abi_cxx11_) {
    psVar5 = (string *)operator_new(0x20);
    (psVar5->_M_dataplus)._M_p = (pointer)&psVar5->field_2;
    psVar5->_M_string_length = 0;
    (psVar5->field_2)._M_local_buf[0] = '\0';
    pCVar4->content_ = psVar5;
  }
  io::StringOutputStream::StringOutputStream(this_00,psVar5);
  return &this_00->super_ZeroCopyOutputStream;
}

Assistant:

virtual io::ZeroCopyOutputStream* OpenForInsert(
      const string& filename, const string& insertion_point) {
    CodeGeneratorResponse::File* file = response_->add_file();
    file->set_name(filename);
    file->set_insertion_point(insertion_point);
    return new io::StringOutputStream(file->mutable_content());
  }